

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_flags_for_ground_items.hpp
# Opt level: O1

void __thiscall
PatchFlagsForGroundItems::add_mask_flags_for_already_taken_items
          (PatchFlagsForGroundItems *this,RandomizerWorld *world)

{
  byte bVar1;
  ItemSource *this_00;
  _func_int **pp_Var2;
  PatchFlagsForGroundItems *pPVar3;
  bool bVar4;
  uint8_t uVar5;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var6;
  ushort uVar7;
  _func_int **pp_Var8;
  pointer ppIVar9;
  pointer ppIVar10;
  bool local_59;
  undefined **local_58;
  ushort local_50;
  byte local_4e [10];
  uint local_44;
  PatchFlagsForGroundItems *local_40;
  pointer local_38;
  
  ppIVar10 = (world->_item_sources).super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppIVar9 = (world->_item_sources).super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppIVar10 != ppIVar9) {
    local_40 = this;
    local_38 = ppIVar9;
    do {
      this_00 = *ppIVar10;
      bVar4 = ItemSource::is_ground_item(this_00);
      pPVar3 = local_40;
      if (bVar4) {
        if (this_00->_item == (Item *)0x0) {
          uVar5 = '?';
        }
        else {
          uVar5 = this_00->_item->_id;
        }
        local_58 = (undefined **)CONCAT71(local_58._1_7_,uVar5);
        _Var6 = std::
                __find_if<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
                          ((local_40->_finite_ground_items).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                           (local_40->_finite_ground_items).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish,&local_58);
        if (_Var6._M_current !=
            (pPVar3->_finite_ground_items).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish) {
LAB_00161e15:
          bVar1 = this_00[1]._name.field_2._M_local_buf[0];
          uVar7 = (ushort)(bVar1 >> 3);
          bVar4 = ItemSource::is_shop_item(this_00);
          local_58 = &PTR_to_json_abi_cxx11__00261860;
          if (bVar4) {
            local_50 = uVar7 + 0x1064;
          }
          else {
            local_50 = uVar7 | 0x1060;
          }
          local_4e[0] = bVar1 & 7;
          pp_Var2 = (_func_int **)this_00[1]._name._M_dataplus._M_p;
          ppIVar9 = local_38;
          for (pp_Var8 = this_00[1]._vptr_ItemSource; local_38 = ppIVar9, pp_Var8 != pp_Var2;
              pp_Var8 = pp_Var8 + 1) {
            local_59 = false;
            local_44 = (uint)(byte)local_50;
            std::vector<EntityMaskFlag,std::allocator<EntityMaskFlag>>::
            emplace_back<bool,int,unsigned_char_const&>
                      ((vector<EntityMaskFlag,std::allocator<EntityMaskFlag>> *)(*pp_Var8 + 0x20),
                       &local_59,(int *)&local_44,local_4e);
            ppIVar9 = local_38;
          }
        }
      }
      else {
        bVar4 = ItemSource::is_shop_item(this_00);
        pPVar3 = local_40;
        if (bVar4) {
          if (this_00->_item == (Item *)0x0) {
            uVar5 = '?';
          }
          else {
            uVar5 = this_00->_item->_id;
          }
          local_58 = (undefined **)CONCAT71(local_58._1_7_,uVar5);
          _Var6 = std::
                  __find_if<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
                            ((local_40->_finite_shop_items).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                             (local_40->_finite_shop_items).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish,&local_58);
          if (_Var6._M_current !=
              (pPVar3->_finite_shop_items).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish) goto LAB_00161e15;
        }
      }
      ppIVar10 = ppIVar10 + 1;
    } while (ppIVar10 != ppIVar9);
  }
  return;
}

Assistant:

void add_mask_flags_for_already_taken_items(RandomizerWorld& world)
    {
        for(ItemSource* item_source : world.item_sources())
        {
            if(item_source->is_ground_item())
            {
                if(!vectools::contains(_finite_ground_items, item_source->item_id()))
                    continue;
            }
            else if(item_source->is_shop_item())
            {
                if(!vectools::contains(_finite_shop_items, item_source->item_id()))
                    continue;
            }
            else continue; // Not a ground/shop item_source

            // If we reach this point, it means the item source contains an item that is considered as finite
            // and must be removed if already taken by the player
            ItemSourceOnGround* ground_source = reinterpret_cast<ItemSourceOnGround*>(item_source);
            Flag flag_source_already_taken = get_checked_flag_for_item_source(ground_source);
            for(Entity* entity : ground_source->entities())
                entity->remove_when_flag_is_set(flag_source_already_taken);
        }
    }